

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize,ZSTD_cParamMode_e mode,
          ZSTD_paramSwitch_e useRowMatchFinder)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_compressionParameters ZVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  unsigned_long_long uVar8;
  ulong uVar9;
  
  ZVar3 = cPar;
  sVar7 = ZSTD_checkCParams(cPar);
  if (sVar7 != 0) {
    __assert_fail("ZSTD_checkCParams(cPar)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5675,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                 );
  }
  switch(mode) {
  case ZSTD_cpm_noAttachDict:
  case ZSTD_cpm_unknown:
    break;
  case ZSTD_cpm_attachDict:
    dictSize = 0;
    break;
  case ZSTD_cpm_createCDict:
    uVar8 = 0x201;
    if (dictSize == 0) {
      uVar8 = srcSize;
    }
    if (srcSize == 0xffffffffffffffff) {
      srcSize = uVar8;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x568e,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                 );
  }
  if (dictSize < 0x40000001 && srcSize < 0x40000001) {
    uVar4 = (int)(srcSize + dictSize) - 1;
    uVar5 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = (uVar5 ^ 0xffffffe0) + 0x21;
    if (srcSize + dictSize < 0x40) {
      uVar5 = 6;
    }
    if (uVar5 < cPar.windowLog) {
      cPar.windowLog = uVar5;
    }
  }
  else if (srcSize == 0xffffffffffffffff) goto LAB_00175b8b;
  uVar5 = cPar.windowLog;
  if (dictSize != 0) {
    if (0x1f < cPar.windowLog) {
      __assert_fail("windowLog <= ZSTD_WINDOWLOG_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5652,"U32 ZSTD_dictAndWindowLog(U32, U64, U64)");
    }
    uVar9 = 1L << ((byte)cPar.windowLog & 0x3f);
    if (uVar9 < srcSize + dictSize) {
      uVar9 = uVar9 + dictSize;
      if (uVar9 < 0x80000000) {
        uVar4 = (int)uVar9 - 1;
        uVar5 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar5 = (uVar5 ^ 0xffffffe0) + 0x21;
      }
      else {
        uVar5 = 0x1f;
      }
    }
  }
  uVar4 = (cPar.chainLog - 1) + (uint)(cPar.strategy < ZSTD_btlazy2);
  if (uVar5 + 1 < cPar.hashLog) {
    cPar.hashLog = uVar5 + 1;
  }
  if (uVar5 < uVar4) {
    cPar.chainLog = (cPar.chainLog + uVar5) - uVar4;
  }
LAB_00175b8b:
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  if (0xfffffffd < cPar.strategy - ZSTD_greedy && mode == ZSTD_cpm_createCDict) {
    if (0x18 < cPar.hashLog) {
      cPar.hashLog = 0x18;
    }
    if (0x18 < cPar.chainLog) {
      cPar.chainLog = 0x18;
    }
  }
  iVar6 = ZSTD_rowMatchFinderUsed
                    (cPar.strategy,useRowMatchFinder + (useRowMatchFinder == ZSTD_ps_auto));
  if (iVar6 != 0) {
    uVar5 = 6;
    if (cPar.searchLog < 6) {
      uVar5 = cPar.searchLog;
    }
    uVar4 = 4;
    if (4 < uVar5) {
      uVar4 = uVar5;
    }
    if (cPar.hashLog < uVar4) {
      __assert_fail("cPar.hashLog >= rowLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x56c4,
                    "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                   );
    }
    if ((uVar4 | 0x18) < cPar.hashLog) {
      cPar.hashLog = uVar4 | 0x18;
    }
  }
  uVar1 = ZVar3._12_8_;
  uVar2 = ZVar3._20_8_;
  __return_storage_ptr__->searchLog = (int)uVar1;
  __return_storage_ptr__->minMatch = (int)((ulong)uVar1 >> 0x20);
  __return_storage_ptr__->targetLength = (int)uVar2;
  __return_storage_ptr__->strategy = (int)((ulong)uVar2 >> 0x20);
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize,
                            ZSTD_cParamMode_e mode,
                            ZSTD_paramSwitch_e useRowMatchFinder)
{
    const U64 minSrcSize = 513; /* (1<<9) + 1 */
    const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
        /* If we don't know the source size, don't make any
         * assumptions about it. We will already have selected
         * smaller parameters if a dictionary is in use.
         */
        break;
    case ZSTD_cpm_createCDict:
        /* Assume a small source size when creating a dictionary
         * with an unknown source size.
         */
        if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            srcSize = minSrcSize;
        break;
    case ZSTD_cpm_attachDict:
        /* Dictionary has its own dedicated parameters which have
         * already been selected. We are selecting parameters
         * for only the source.
         */
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize <= maxWindowResize)
      && (dictSize <= maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (srcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const dictAndWindowLog = ZSTD_dictAndWindowLog(cPar.windowLog, (U64)srcSize, (U64)dictSize);
        U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cPar.hashLog > dictAndWindowLog+1) cPar.hashLog = dictAndWindowLog+1;
        if (cycleLog > dictAndWindowLog)
            cPar.chainLog -= (cycleLog - dictAndWindowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    /* We can't use more than 32 bits of hash in total, so that means that we require:
     * (hashLog + 8) <= 32 && (chainLog + 8) <= 32
     */
    if (mode == ZSTD_cpm_createCDict && ZSTD_CDictIndicesAreTagged(&cPar)) {
        U32 const maxShortCacheHashLog = 32 - ZSTD_SHORT_CACHE_TAG_BITS;
        if (cPar.hashLog > maxShortCacheHashLog) {
            cPar.hashLog = maxShortCacheHashLog;
        }
        if (cPar.chainLog > maxShortCacheHashLog) {
            cPar.chainLog = maxShortCacheHashLog;
        }
    }


    /* At this point, we aren't 100% sure if we are using the row match finder.
     * Unless it is explicitly disabled, conservatively assume that it is enabled.
     * In this case it will only be disabled for small sources, so shrinking the
     * hash log a little bit shouldn't result in any ratio loss.
     */
    if (useRowMatchFinder == ZSTD_ps_auto)
        useRowMatchFinder = ZSTD_ps_enable;

    /* We can't hash more than 32-bits in total. So that means that we require:
     * (hashLog - rowLog + 8) <= 32
     */
    if (ZSTD_rowMatchFinderUsed(cPar.strategy, useRowMatchFinder)) {
        /* Switch to 32-entry rows if searchLog is 5 (or more) */
        U32 const rowLog = BOUNDED(4, cPar.searchLog, 6);
        U32 const maxRowHashLog = 32 - ZSTD_ROW_HASH_TAG_BITS;
        U32 const maxHashLog = maxRowHashLog + rowLog;
        assert(cPar.hashLog >= rowLog);
        if (cPar.hashLog > maxHashLog) {
            cPar.hashLog = maxHashLog;
        }
    }

    return cPar;
}